

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O0

bool __thiscall test_case::eval_perf(test_case *this,ggml_backend_t backend,char *op_name)

{
  FILE *pFVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  pointer pgVar9;
  pointer pgVar10;
  anon_class_1_0_00000001 *this_00;
  undefined8 uVar11;
  ulong uVar12;
  int *piVar13;
  size_t sVar14;
  undefined8 uVar15;
  ulong uVar16;
  long in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  undefined1 auVar17 [16];
  undefined1 auVar18 [12];
  anon_class_1_0_00000001 format_flops;
  double flops_per_sec;
  int64_t end_time;
  ggml_status status_1;
  int64_t start_time;
  int total_runs;
  int64_t total_mem;
  int64_t total_time_us;
  int i_1;
  anon_class_1_0_00000001 tensor_op_size;
  size_t mem;
  int i;
  size_t target_size;
  size_t target_size_gpu;
  size_t target_size_cpu;
  size_t GB;
  uint64_t target_flops;
  uint64_t target_flops_gpu;
  uint64_t target_flops_cpu;
  uint64_t GFLOP;
  bool is_cpu;
  int n_runs;
  ggml_status status;
  ggml_cgraph *gf;
  ggml_backend_buffer_ptr buf;
  int last;
  int align;
  int len;
  ggml_tensor *out;
  ggml_context_ptr ctx;
  ggml_init_params params;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  ggml_tensor *t;
  anon_class_1_0_00000001 *in_stack_fffffffffffffcd0;
  undefined4 in_stack_fffffffffffffde0;
  undefined4 uVar19;
  bool local_209;
  string local_1f0 [32];
  string local_1d0 [40];
  double local_1a8;
  long local_1a0;
  int local_194;
  long local_190;
  int local_184;
  long local_180;
  long local_178;
  int local_170;
  long local_168;
  int local_15c;
  int local_158;
  int local_154;
  ulong local_150;
  undefined8 local_148;
  undefined8 local_140;
  undefined8 local_138;
  int local_130;
  int local_12c;
  ulong local_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_110;
  byte local_101;
  int local_100;
  int local_fc;
  undefined8 local_f8;
  int local_e8;
  undefined4 local_e4;
  string local_e0 [32];
  string local_c0 [36];
  int local_9c;
  undefined4 local_98;
  byte local_91;
  string local_90 [32];
  long local_70;
  undefined4 local_64;
  undefined8 local_60;
  pointer local_58;
  undefined8 local_50;
  ggml_tensor *local_48;
  pointer local_38;
  undefined8 local_30;
  undefined1 local_28;
  undefined7 uStack_27;
  long local_20;
  undefined8 local_18;
  byte local_1;
  
  *(undefined4 *)(in_RDI + 3) = 1;
  local_20 = in_RDX;
  local_18 = in_RSI;
  lVar7 = ggml_tensor_overhead();
  lVar8 = ggml_graph_overhead_custom(0x2000,0);
  pgVar9 = (pointer)(lVar7 * 0x80 + lVar8);
  local_30 = 0;
  local_28 = 1;
  local_50 = 0;
  t = (ggml_tensor *)CONCAT71(uStack_27,1);
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_58 = pgVar9;
  local_48 = t;
  local_38 = pgVar9;
  ggml_init();
  std::unique_ptr<ggml_context,ggml_context_deleter>::unique_ptr<ggml_context_deleter,void>
            ((unique_ptr<ggml_context,_ggml_context_deleter> *)__lhs,pgVar9);
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<ggml_context,_ggml_context_deleter> *)0x179450);
  if (!bVar2) {
    auVar18 = ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/tests/test-backend-ops.cpp"
                         ,0x25f,"GGML_ASSERT(%s) failed","ctx");
    local_64 = auVar18._8_4_;
    local_60 = auVar18._0_8_;
    std::unique_ptr<ggml_context,_ggml_context_deleter>::~unique_ptr
              ((unique_ptr<ggml_context,_ggml_context_deleter> *)__lhs);
    _Unwind_Resume(local_60);
  }
  pgVar10 = std::unique_ptr<ggml_context,_ggml_context_deleter>::get
                      ((unique_ptr<ggml_context,_ggml_context_deleter> *)__lhs);
  local_70 = (**(code **)(*in_RDI + 0x20))(in_RDI,pgVar10);
  local_91 = 0;
  local_209 = false;
  if (local_20 != 0) {
    (**(code **)(*in_RDI + 0x10))(local_90,in_RDI,local_70);
    local_91 = 1;
    local_209 = std::operator!=(__lhs,(char *)pgVar9);
  }
  if ((local_91 & 1) != 0) {
    std::__cxx11::string::~string(local_90);
  }
  if (local_209 == false) {
    (**(code **)(*in_RDI + 0x10))(local_c0,in_RDI,local_70);
    this_00 = (anon_class_1_0_00000001 *)std::__cxx11::string::c_str();
    (**(code **)(*in_RDI + 0x18))(local_e0);
    uVar11 = std::__cxx11::string::c_str();
    iVar4 = printf("  %s(%s): ",this_00,uVar11);
    std::__cxx11::string::~string(local_e0);
    std::__cxx11::string::~string(local_c0);
    local_9c = iVar4;
    fflush(_stdout);
    bVar3 = ggml_backend_supports_op(local_18,local_70);
    uVar19 = CONCAT13(bVar3,(int3)in_stack_fffffffffffffde0);
    if ((bVar3 & 1) == 0) {
      printf("not supported\n");
      local_1 = 1;
      local_98 = 1;
    }
    else {
      local_e4 = 8;
      local_e8 = ((local_9c + 7) / 8) * 8;
      if (local_e8 - local_9c < 5) {
        local_e8 = local_e8 + 8;
      }
      printf("%*s",(ulong)(uint)(local_e8 - local_9c),"");
      pgVar10 = std::unique_ptr<ggml_context,_ggml_context_deleter>::get
                          ((unique_ptr<ggml_context,_ggml_context_deleter> *)__lhs);
      ggml_backend_alloc_ctx_tensors(pgVar10,local_18);
      std::unique_ptr<ggml_backend_buffer,ggml_backend_buffer_deleter>::
      unique_ptr<ggml_backend_buffer_deleter,void>
                ((unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter> *)__lhs,
                 (pointer)pgVar9);
      bVar2 = std::operator==((unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter> *)__lhs,
                              pgVar9);
      if (bVar2) {
        printf("failed to allocate tensors\n");
        local_1 = 0;
      }
      else {
        pgVar9 = std::unique_ptr<ggml_context,_ggml_context_deleter>::get
                           ((unique_ptr<ggml_context,_ggml_context_deleter> *)__lhs);
        (**(code **)(*in_RDI + 0x58))(in_RDI,pgVar9);
        pgVar9 = std::unique_ptr<ggml_context,_ggml_context_deleter>::get
                           ((unique_ptr<ggml_context,_ggml_context_deleter> *)__lhs);
        local_f8 = ggml_new_graph_custom(pgVar9,0x2000,0);
        ggml_build_forward_expand(local_f8,local_70);
        local_fc = ggml_backend_graph_compute(local_18,local_f8);
        pFVar1 = _stderr;
        if (local_fc == 0) {
          uVar11 = ggml_backend_get_device(local_18);
          iVar5 = ggml_backend_dev_type(uVar11);
          local_101 = iVar5 == 0;
          lVar7 = (**(code **)(*in_RDI + 0x68))(in_RDI,local_70);
          if (lVar7 == 0) {
            local_138 = 0x40000000;
            local_140 = 0x200000000;
            local_150 = 0x800000000;
            local_148 = 0x800000000;
            if ((local_101 & 1) != 0) {
              local_150 = 0x200000000;
            }
            iVar5 = ggml_graph_size(local_f8);
            local_154 = ggml_graph_n_nodes(local_f8);
            uVar16 = local_150;
            local_154 = iVar5 - local_154;
            uVar12 = (**(code **)(*in_RDI + 0x60))(in_RDI,local_70);
            local_158 = (int)(uVar16 / uVar12);
            piVar13 = std::min<int>(&local_154,&local_158);
            local_100 = *piVar13;
          }
          else {
            local_110 = 1000000000;
            local_118 = 8000000000;
            local_128 = 100000000000;
            local_120 = 100000000000;
            if ((local_101 & 1) != 0) {
              local_128 = 8000000000;
            }
            iVar5 = ggml_graph_size(local_f8);
            local_12c = ggml_graph_n_nodes(local_f8);
            uVar16 = local_128;
            local_12c = iVar5 - local_12c;
            uVar12 = (**(code **)(*in_RDI + 0x68))(in_RDI,local_70);
            local_130 = (int)(uVar16 / uVar12);
            piVar13 = std::min<int>(&local_12c,&local_130);
            local_100 = *piVar13;
          }
          local_100 = local_100 + 1;
          for (local_15c = 1; local_15c < local_100; local_15c = local_15c + 1) {
            ggml_graph_add_node(local_f8,local_70);
          }
          lVar7 = (long)local_100;
          local_168 = (**(code **)(*in_RDI + 0x60))(in_RDI,local_70);
          local_168 = lVar7 * local_168;
          for (local_170 = 0; iVar5 = local_170, iVar6 = ggml_graph_n_nodes(local_f8), iVar5 < iVar6
              ; local_170 = local_170 + 1) {
            lVar7 = ggml_graph_node(local_f8,local_170);
            bVar2 = ggml_is_view_op(*(ggml_op *)(lVar7 + 0x50));
            if ((!bVar2) && (lVar7 = ggml_graph_node(local_f8,local_170), lVar7 != local_70)) {
              ggml_graph_node(local_f8,local_170);
              sVar14 = eval_perf::anon_class_1_0_00000001::operator()(in_stack_fffffffffffffcd0,t);
              local_168 = sVar14 + local_168;
            }
          }
          local_178 = 0;
          local_180 = 0;
          local_184 = 0;
          do {
            local_190 = ggml_time_us();
            local_194 = ggml_backend_graph_compute(local_18,local_f8);
            pFVar1 = _stderr;
            if (local_194 != 0) {
              uVar11 = ggml_status_to_string(local_194);
              fprintf(pFVar1,"%s: ggml_backend_graph_compute failed. status=%s \n","eval_perf",
                      uVar11);
              local_1 = 0;
              goto LAB_0017a0e9;
            }
            local_1a0 = ggml_time_us();
            local_178 = (local_1a0 - local_190) + local_178;
            local_180 = local_168 + local_180;
            local_184 = local_100 + local_184;
          } while (local_178 < 1000000);
          printf("    %8d runs - %8.2f us/run - ",(double)local_178 / (double)local_184);
          lVar7 = (**(code **)(*in_RDI + 0x68))(in_RDI,local_70);
          if (lVar7 == 0) {
            uVar16 = (**(code **)(*in_RDI + 0x60))(in_RDI,local_70);
            printf("%8zu kB/run - \x1b[1;34m%7.2f GB/s\x1b[0m",
                   ((double)local_180 / ((double)local_178 / 1000000.0)) * 0.0009765625 *
                   0.0009765625 * 0.0009765625,uVar16 >> 10);
          }
          else {
            lVar7 = (**(code **)(*in_RDI + 0x68))(in_RDI,local_70);
            lVar7 = lVar7 * local_184;
            auVar17._8_4_ = (int)((ulong)lVar7 >> 0x20);
            auVar17._0_8_ = lVar7;
            auVar17._12_4_ = 0x45300000;
            local_1a8 = ((auVar17._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)) /
                        ((double)local_178 / 1000000.0);
            (**(code **)(*in_RDI + 0x68))(in_RDI,local_70);
            eval_perf(ggml_backend*,char_const*)::{lambda(double)#1}::operator()[abi_cxx11_
                      (this_00,(double)CONCAT44(iVar4,uVar19));
            uVar11 = std::__cxx11::string::c_str();
            eval_perf(ggml_backend*,char_const*)::{lambda(double)#1}::operator()[abi_cxx11_
                      (this_00,(double)CONCAT44(iVar4,uVar19));
            uVar15 = std::__cxx11::string::c_str();
            printf("%s/run - \x1b[1;34m%sS\x1b[0m",uVar11,uVar15);
            std::__cxx11::string::~string(local_1f0);
            std::__cxx11::string::~string(local_1d0);
          }
          printf("\n");
          local_1 = 1;
        }
        else {
          uVar11 = ggml_status_to_string(local_fc);
          fprintf(pFVar1,"%s: ggml_backend_graph_compute failed. status=%s \n","eval_perf",uVar11);
          local_1 = 0;
        }
      }
LAB_0017a0e9:
      local_98 = 1;
      std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>::~unique_ptr
                ((unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter> *)__lhs);
    }
  }
  else {
    local_1 = 1;
    local_98 = 1;
  }
  std::unique_ptr<ggml_context,_ggml_context_deleter>::~unique_ptr
            ((unique_ptr<ggml_context,_ggml_context_deleter> *)__lhs);
  return (bool)(local_1 & 1);
}

Assistant:

bool eval_perf(ggml_backend_t backend, const char * op_name) {
        mode = MODE_PERF;

        static const size_t graph_nodes = 8192;

        ggml_init_params params = {
            /* .mem_size = */ ggml_tensor_overhead()*128 + ggml_graph_overhead_custom(graph_nodes, false),
            /* .mem_base = */ NULL,
            /* .no_alloc = */ true,
        };
        ggml_context_ptr ctx(ggml_init(params)); // smart ptr
        GGML_ASSERT(ctx);

        ggml_tensor * out = build_graph(ctx.get());

        if (op_name != nullptr && op_desc(out) != op_name) {
            //printf("  %s: skipping\n", op_desc(out).c_str());
            return true;
        }

        int len = printf("  %s(%s): ", op_desc(out).c_str(), vars().c_str());
        fflush(stdout);

        // check if backends support op
        if (!ggml_backend_supports_op(backend, out)) {
            printf("not supported\n");
            return true;
        }

        // align while also leaving some margin for variations in parameters
        int align = 8;
        int last = (len + align - 1) / align * align;
        if (last - len < 5) {
            last += align;
        }
        printf("%*s", last - len, "");

        // allocate
        ggml_backend_buffer_ptr buf(ggml_backend_alloc_ctx_tensors(ctx.get(), backend)); // smart ptr

        if (buf == NULL) {
            printf("failed to allocate tensors\n");
            return false;
        }

        // randomize tensors
        initialize_tensors(ctx.get());

        // build graph
        ggml_cgraph * gf = ggml_new_graph_custom(ctx.get(), graph_nodes, false);
        ggml_build_forward_expand(gf, out);

        // warmup run
        ggml_status status = ggml_backend_graph_compute(backend, gf);
        if (status != GGML_STATUS_SUCCESS) {
            fprintf(stderr, "%s: ggml_backend_graph_compute failed. status=%s \n", __func__, ggml_status_to_string(status));
            return false;
        }

        // determine number of runs
        int n_runs;
        bool is_cpu = ggml_backend_dev_type(ggml_backend_get_device(backend)) == GGML_BACKEND_DEVICE_TYPE_CPU;
        if (op_flops(out) > 0) {
            // based on flops
            const uint64_t GFLOP = 1000 * 1000 * 1000;
            const uint64_t target_flops_cpu =   8ULL * GFLOP;
            const uint64_t target_flops_gpu = 100ULL * GFLOP;
            uint64_t target_flops = is_cpu ? target_flops_cpu : target_flops_gpu;
            n_runs = std::min<int>(ggml_graph_size(gf) - ggml_graph_n_nodes(gf), target_flops / op_flops(out)) + 1;
        } else {
            // based on memory size
            const size_t GB = 1ULL << 30;
            const size_t target_size_cpu =  8 * GB;
            const size_t target_size_gpu = 32 * GB;
            size_t target_size = is_cpu ? target_size_cpu : target_size_gpu;
            n_runs = std::min<int>(ggml_graph_size(gf) - ggml_graph_n_nodes(gf), target_size / op_size(out)) + 1;
        }

        // duplicate the op
        for (int i = 1; i < n_runs; i++) {
            ggml_graph_add_node(gf, out);
        }

        // calculate memory
        size_t mem = n_runs * op_size(out);
        auto tensor_op_size = [](ggml_tensor * t) {
            size_t size = ggml_nbytes(t);
            // add source tensors
            for (int i = 0; i < GGML_MAX_SRC; i++) {
                if (t->src[i] != NULL) {
                    size += ggml_nbytes(t->src[i]);
                }
            }
            return size;
        };
        for (int i = 0; i < ggml_graph_n_nodes(gf); ++i) {
            if (ggml_is_view_op(ggml_graph_node(gf, i)->op) || ggml_graph_node(gf, i) == out) {
                continue;
            }
            mem += tensor_op_size(ggml_graph_node(gf, i));
        }

        // run
        int64_t total_time_us = 0;
        int64_t total_mem = 0;
        int total_runs = 0;
        do {
            int64_t start_time = ggml_time_us();
            ggml_status status = ggml_backend_graph_compute(backend, gf);
            if (status != GGML_STATUS_SUCCESS) {
                fprintf(stderr, "%s: ggml_backend_graph_compute failed. status=%s \n", __func__, ggml_status_to_string(status));
                return false;
            }
            int64_t end_time = ggml_time_us();

            total_time_us += end_time - start_time;
            total_mem += mem;
            total_runs += n_runs;
        } while (total_time_us < 1000*1000); // run for at least 1 second

        printf("    %8d runs - %8.2f us/run - ",
            total_runs,
            (double)total_time_us / total_runs);

        if (op_flops(out) > 0) {
            double flops_per_sec = (op_flops(out) * total_runs) / (total_time_us / 1e6);
            auto format_flops = [](double flops) -> std::string {
                char buf[256];
                if (flops >= 1e12) {
                    snprintf(buf, sizeof(buf), "%6.2f TFLOP", flops / 1e12);
                } else if (flops >= 1e9) {
                    snprintf(buf, sizeof(buf), "%6.2f GFLOP", flops / 1e9);
                } else if (flops >= 1e6) {
                    snprintf(buf, sizeof(buf), "%6.2f MFLOP", flops / 1e6);
                } else {
                    snprintf(buf, sizeof(buf), "%6.2f KFLOP", flops / 1e3);
                }
                return buf;
            };
            printf("%s/run - \033[1;34m%sS\033[0m",
                format_flops(op_flops(out)).c_str(),
                format_flops(flops_per_sec).c_str());

        } else {
            printf("%8zu kB/run - \033[1;34m%7.2f GB/s\033[0m",
                op_size(out) / 1024,
                total_mem / (total_time_us / 1e6) / 1024.0 / 1024.0 / 1024.0);
        }
        printf("\n");

        return true;
    }